

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspirehand.hpp
# Opt level: O3

bool __thiscall
InspireHand::getAngle
          (InspireHand *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *fingers)

{
  bool bVar1;
  value_type_conflict2 *__val;
  ssize_t sVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  ProtoGetAngle p;
  progress_timer t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sendBuf;
  ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546> local_5c;
  progress_timer local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_58.super_timer._start_time = clock();
  local_58.m_os = (ostream *)&std::cout;
  local_5c.super_ProtocolBase._id = this->_id;
  local_5c.super_ProtocolBase._order = '\x11';
  local_5c.super_ProtocolBase._register_address = 0x60a;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::getRequestBuffer(&local_5c,&local_48);
  sVar2 = send(this,(int)&local_48,__buf,in_RCX,in_R8D);
  if ((char)sVar2 == '\0') {
    bVar1 = false;
  }
  else {
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x14);
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x14;
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    receive(this,&local_28,0x14);
    bVar1 = ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::parseReturnBuffer
                      (&local_5c,&local_28,fingers);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR::InspireHand::GetAngle::Return false",0x2a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
    }
    if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  boost::progress_timer::~progress_timer(&local_58);
  return bVar1;
}

Assistant:

bool getAngle(std::vector<uint16_t> &fingers) {
//        fingers.clear();
        boost::progress_timer t;
        ProtoGetAngle p(_id);
        std::vector<uint8_t> sendBuf;
        p.getRequestBuffer(sendBuf);
        if(!send(sendBuf)) {
            return false;
        }

        std::vector<uint8_t> recvBuf(12 + 8);
        receive(recvBuf, recvBuf.size());

        if(!p.parseReturnBuffer(recvBuf, fingers)) {
            std::cout << "ERROR::InspireHand::GetAngle::Return false" << std::endl;
            return false;
        }

        return true;
    }